

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::ValueNumberTable::AssignValueNumber(ValueNumberTable *this,Instruction *inst)

{
  byte bVar1;
  IRContext *this_00;
  DecorationManager *this_01;
  uint **ppuVar2;
  bool bVar3;
  byte bVar4;
  uint32_t uVar5;
  CommonDebugInfoInstructions CVar6;
  Op OVar7;
  mapped_type *pmVar8;
  Operand *pOVar9;
  iterator iVar10;
  iterator iVar11;
  uint32_t *puVar12;
  uint32_t uVar13;
  uint **ppuVar14;
  uint uVar15;
  uint uVar16;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> __ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_02;
  uint32_t id_value;
  Instruction value_ins;
  array<signed_char,_4UL> local_10c;
  undefined1 local_108 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e0;
  IRContext *local_d0;
  undefined1 local_c8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  Instruction local_a0;
  
  uVar5 = GetValueNumber(this,inst);
  if (uVar5 != 0) {
    return uVar5;
  }
  bVar3 = IRContext::IsCombinatorInstruction(this->context_,inst);
  if ((bVar3) ||
     (CVar6 = Instruction::GetCommonDebugOpcode(inst), CVar6 != CommonDebugInfoInstructionsMax)) {
    uVar16 = inst->opcode_ - OpVariable;
    if (((uVar16 < 0x2a) && ((0x20008000001U >> ((ulong)uVar16 & 0x3f) & 1) != 0)) ||
       ((bVar3 = spvOpcodeIsLoad(inst->opcode_), bVar3 &&
        (bVar3 = Instruction::IsReadOnlyLoad(inst), !bVar3)))) goto LAB_00518258;
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(this_00);
    }
    this_01 = (this_00->decoration_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
              _M_head_impl;
    OVar7 = inst->opcode_;
    if (OVar7 == OpCopyObject) {
      bVar4 = inst->has_result_id_;
      if ((bool)bVar4 == true) {
        uVar5 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
        bVar4 = inst->has_result_id_;
        uVar13 = (bVar4 & 1) + 1;
      }
      else {
        uVar5 = 0;
        uVar13 = 1;
      }
      uVar16 = (uint)bVar4;
      if (inst->has_type_id_ != false) {
        uVar16 = uVar13;
      }
      uVar13 = Instruction::GetSingleWordOperand(inst,uVar16);
      bVar3 = analysis::DecorationManager::HaveTheSameDecorations(this_01,uVar5,uVar13);
      if (!bVar3) {
LAB_00518361:
        OVar7 = inst->opcode_;
        goto LAB_00518365;
      }
      uVar5 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar5 = (uint)inst->has_result_id_;
      }
      uVar5 = Instruction::GetSingleWordOperand(inst,uVar5);
      uVar5 = GetValueNumber(this,uVar5);
      if (uVar5 == 0) goto LAB_00518361;
      goto LAB_00518263;
    }
LAB_00518365:
    if (OVar7 != OpPhi) {
LAB_005184a7:
      local_d0 = this->context_;
      OVar7 = inst->opcode_;
      uVar13 = 0;
      uVar5 = 0;
      if (inst->has_type_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(inst,0);
      }
      if (inst->has_result_id_ == true) {
        uVar13 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      local_108._0_8_ = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      Instruction::Instruction
                (&local_a0,local_d0,OVar7,uVar5,uVar13,
                 (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 local_108);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 local_108);
      uVar16 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar16 = (uint)inst->has_result_id_;
      }
      if (uVar16 != (int)((ulong)((long)(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(inst->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555) {
        local_d0 = (IRContext *)&this->id_to_value_;
        uVar5 = 0;
        do {
          pOVar9 = Instruction::GetInOperand(inst,uVar5);
          bVar3 = spvIsIdType(pOVar9->type);
          if (bVar3) {
            ppuVar2 = (uint **)(pOVar9->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar14 = &(pOVar9->words).small_data_;
            if (ppuVar2 != (uint **)0x0) {
              ppuVar14 = ppuVar2;
            }
            local_10c._M_elems = *(_Type *)*ppuVar14;
            iVar10 = std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_d0,(key_type_conflict *)&local_10c);
            if (iVar10.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                ._M_cur != (__node_type *)0x0) {
              local_10c._M_elems =
                   (_Type)(*(uint *)((long)iVar10.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                           ._M_cur + 0xc) | 0x80000000);
            }
            local_c8._0_8_ = &PTR__SmallVector_00b02ef8;
            local_c8._24_8_ = local_c8 + 0x10;
            local_a8._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
            local_c8._8_8_ = 1;
            local_108._0_4_ = pOVar9->type;
            local_108._8_8_ = &PTR__SmallVector_00b02ef8;
            local_108._16_8_ = (pointer)0x0;
            local_108._32_8_ = local_108 + 0x18;
            local_e0._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
            local_c8._16_4_ = local_10c._M_elems;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),
                       (SmallVector<unsigned_int,_2UL> *)local_c8);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
            emplace_back<spvtools::opt::Operand>(&local_a0.operands_,(Operand *)local_108);
            local_108._8_8_ = &PTR__SmallVector_00b02ef8;
            if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )local_e0._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_e0,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         local_e0._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl);
            }
            local_e0._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
            local_c8._0_8_ = &PTR__SmallVector_00b02ef8;
            if (local_a8._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl !=
                (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )0x0) {
              this_02 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
                        )&local_a8;
              __ptr._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8;
LAB_005186b7:
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()(this_02,__ptr._M_head_impl);
            }
          }
          else {
            local_108._0_4_ = pOVar9->type;
            local_108._8_8_ = &PTR__SmallVector_00b02ef8;
            local_108._16_8_ = (pointer)0x0;
            local_108._32_8_ = local_108 + 0x18;
            local_e0._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),&pOVar9->words);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
            emplace_back<spvtools::opt::Operand>(&local_a0.operands_,(Operand *)local_108);
            local_108._8_8_ = &PTR__SmallVector_00b02ef8;
            if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )local_e0._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              this_02 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
                        )&local_e0;
              __ptr._M_head_impl =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_e0._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl;
              goto LAB_005186b7;
            }
          }
          uVar5 = uVar5 + 1;
          uVar16 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar16 = (uint)inst->has_result_id_;
          }
        } while (uVar5 < (int)((ulong)((long)(inst->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar16);
      }
      iVar11 = std::
               _Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this,&local_a0);
      if (iVar11.
          super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar5 = this->next_value_number_;
        this->next_value_number_ = uVar5 + 1;
        uVar13 = 0;
        if (inst->has_result_id_ == true) {
          uVar13 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
        }
        local_108._0_4_ = uVar13;
        pmVar8 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_value_,(key_type *)local_108);
        *pmVar8 = uVar5;
        puVar12 = std::__detail::
                  _Map_base<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,&local_a0);
      }
      else {
        uVar13 = 0;
        uVar5 = 0;
        if (*(char *)((long)iVar11.
                            super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_true>
                            ._M_cur + 0x35) == '\x01') {
          uVar5 = Instruction::GetSingleWordOperand
                            ((Instruction *)
                             ((long)iVar11.
                                    super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_true>
                                    ._M_cur + 8),
                             (uint)*(byte *)((long)iVar11.
                                                  super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_true>
                                                  ._M_cur + 0x34));
        }
        local_108._0_4_ = uVar5;
        pmVar8 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_value_,(key_type *)local_108);
        uVar5 = *pmVar8;
        if (inst->has_result_id_ == true) {
          uVar13 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
        }
        local_108._0_4_ = uVar13;
        puVar12 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->id_to_value_,(key_type *)local_108);
      }
      *puVar12 = uVar5;
      Instruction::~Instruction(&local_a0);
      return uVar5;
    }
    bVar3 = inst->has_result_id_;
    uVar16 = (bVar3 & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar16 = (uint)bVar3;
    }
    if (uVar16 == (int)((ulong)((long)(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555)
    goto LAB_005184a7;
    uVar5 = 0;
    if ((bVar3 & 1U) != 0) {
      uVar5 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      uVar16 = (inst->has_result_id_ & 1) + 1;
      if ((inst->has_type_id_ & 1U) == 0) {
        uVar16 = (uint)inst->has_result_id_;
      }
    }
    uVar13 = Instruction::GetSingleWordOperand(inst,uVar16);
    bVar3 = analysis::DecorationManager::HaveTheSameDecorations(this_01,uVar5,uVar13);
    if (!bVar3) goto LAB_005184a7;
    uVar5 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar5 = (uint)inst->has_result_id_;
    }
    uVar5 = Instruction::GetSingleWordOperand(inst,uVar5);
    uVar5 = GetValueNumber(this,uVar5);
    if (uVar5 == 0) goto LAB_005184a7;
    bVar4 = inst->has_type_id_;
    bVar1 = inst->has_result_id_;
    uVar16 = (bVar1 & 1) + 1;
    if ((bool)bVar4 == false) {
      uVar16 = (uint)bVar1;
    }
    if (2 < (int)((ulong)((long)(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
            uVar16) {
      uVar15 = 2;
      do {
        uVar13 = Instruction::GetSingleWordOperand(inst,uVar16 + uVar15);
        uVar13 = GetValueNumber(this,uVar13);
        if (uVar5 != uVar13) goto LAB_005184a7;
        uVar15 = uVar15 + 2;
        bVar4 = inst->has_type_id_;
        bVar1 = inst->has_result_id_;
        uVar16 = (bVar1 & 1) + 1;
        if ((bool)bVar4 == false) {
          uVar16 = (uint)bVar1;
        }
      } while (uVar15 < (int)((ulong)((long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555 - uVar16);
    }
    local_a0.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase._0_4_ = 0;
    if ((bVar1 & 1) == 0) goto LAB_0051827d;
  }
  else {
LAB_00518258:
    uVar5 = this->next_value_number_;
    this->next_value_number_ = uVar5 + 1;
LAB_00518263:
    local_a0.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase._0_4_ = 0;
    if (inst->has_result_id_ != true) goto LAB_0051827d;
    bVar4 = inst->has_type_id_;
  }
  local_a0.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase._0_4_ =
       Instruction::GetSingleWordOperand(inst,(uint)bVar4);
LAB_0051827d:
  pmVar8 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->id_to_value_,(key_type *)&local_a0);
  *pmVar8 = uVar5;
  return uVar5;
}

Assistant:

uint32_t ValueNumberTable::AssignValueNumber(Instruction* inst) {
  // If it already has a value return that.
  uint32_t value = GetValueNumber(inst);
  if (value != 0) {
    return value;
  }

  // If the instruction has other side effects, then it must
  // have its own value number.
  // OpSampledImage and OpImage must remain in the same basic block in which
  // they are used, because of this we will assign each one it own value number.
  if (!context()->IsCombinatorInstruction(inst) &&
      !inst->IsCommonDebugInstr()) {
    value = TakeNextValueNumber();
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  switch (inst->opcode()) {
    case spv::Op::OpSampledImage:
    case spv::Op::OpImage:
    case spv::Op::OpVariable:
      value = TakeNextValueNumber();
      id_to_value_[inst->result_id()] = value;
      return value;
    default:
      break;
  }

  // If it is a load from memory that can be modified, we have to assume the
  // memory has been modified, so we give it a new value number.
  //
  // Note that this test will also handle volatile loads because they are not
  // read only.  However, if this is ever relaxed because we analyze stores, we
  // will have to add a new case for volatile loads.
  if (inst->IsLoad() && !inst->IsReadOnlyLoad()) {
    value = TakeNextValueNumber();
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  analysis::DecorationManager* dec_mgr = context()->get_decoration_mgr();

  // When we copy an object, the value numbers should be the same.
  if (inst->opcode() == spv::Op::OpCopyObject &&
      dec_mgr->HaveTheSameDecorations(inst->result_id(),
                                      inst->GetSingleWordInOperand(0))) {
    value = GetValueNumber(inst->GetSingleWordInOperand(0));
    if (value != 0) {
      id_to_value_[inst->result_id()] = value;
      return value;
    }
  }

  // Phi nodes are a type of copy.  If all of the inputs have the same value
  // number, then we can assign the result of the phi the same value number.
  if (inst->opcode() == spv::Op::OpPhi && inst->NumInOperands() > 0 &&
      dec_mgr->HaveTheSameDecorations(inst->result_id(),
                                      inst->GetSingleWordInOperand(0))) {
    value = GetValueNumber(inst->GetSingleWordInOperand(0));
    if (value != 0) {
      for (uint32_t op = 2; op < inst->NumInOperands(); op += 2) {
        if (value != GetValueNumber(inst->GetSingleWordInOperand(op))) {
          value = 0;
          break;
        }
      }
      if (value != 0) {
        id_to_value_[inst->result_id()] = value;
        return value;
      }
    }
  }

  // Replace all of the operands by their value number.  The sign bit will be
  // set to distinguish between an id and a value number.
  Instruction value_ins(context(), inst->opcode(), inst->type_id(),
                        inst->result_id(), {});
  for (uint32_t o = 0; o < inst->NumInOperands(); ++o) {
    const Operand& op = inst->GetInOperand(o);
    if (spvIsIdType(op.type)) {
      uint32_t id_value = op.words[0];
      auto use_id_to_val = id_to_value_.find(id_value);
      if (use_id_to_val != id_to_value_.end()) {
        id_value = (1 << 31) | use_id_to_val->second;
      }
      value_ins.AddOperand(Operand(op.type, {id_value}));
    } else {
      value_ins.AddOperand(Operand(op.type, op.words));
    }
  }

  // TODO: Implement a normal form for opcodes that commute like integer
  // addition.  This will let us know that a+b is the same value as b+a.

  // Otherwise, we check if this value has been computed before.
  auto value_iterator = instruction_to_value_.find(value_ins);
  if (value_iterator != instruction_to_value_.end()) {
    value = id_to_value_[value_iterator->first.result_id()];
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  // If not, assign it a new value number.
  value = TakeNextValueNumber();
  id_to_value_[inst->result_id()] = value;
  instruction_to_value_[value_ins] = value;
  return value;
}